

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O2

void z_div(doublecomplex *c,doublecomplex *a,doublecomplex *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  doublecomplex dVar8;
  
  dVar8 = *b;
  dVar3 = dVar8.r;
  dVar5 = dVar8.i;
  auVar6._0_8_ = -dVar3;
  auVar6._8_8_ = -dVar5;
  auVar6 = maxpd(auVar6,(undefined1  [16])dVar8);
  if (auVar6._0_8_ <= auVar6._8_8_) {
    if ((dVar5 == 0.0) && (!NAN(dVar5))) {
      fwrite("z_div.c: division by zero\n",0x1a,1,_stderr);
      exit(-1);
    }
    dVar3 = dVar3 / dVar5;
    dVar5 = (dVar3 * dVar3 + 1.0) * dVar5;
    auVar4._0_8_ = dVar3 * a->r + a->i;
    auVar4._8_8_ = dVar3 * a->i + -a->r;
    auVar2._8_8_ = dVar5;
    auVar2._0_8_ = dVar5;
    dVar8 = (doublecomplex)divpd(auVar4,auVar2);
  }
  else {
    dVar5 = dVar5 / dVar3;
    dVar3 = (dVar5 * dVar5 + 1.0) * dVar3;
    auVar7._0_8_ = dVar5 * a->i + a->r;
    auVar7._8_8_ = dVar5 * -a->r + a->i;
    auVar1._8_8_ = dVar3;
    auVar1._0_8_ = dVar3;
    dVar8 = (doublecomplex)divpd(auVar7,auVar1);
  }
  *c = dVar8;
  return;
}

Assistant:

void z_div(doublecomplex *c, const doublecomplex *a, const doublecomplex *b)
{
    double ratio, den;
    double abr, abi, cr, ci;
  
    if( (abr = b->r) < 0.)
	abr = - abr;
    if( (abi = b->i) < 0.)
	abi = - abi;
    if( abr <= abi ) {
	if (abi == 0) {
	    fprintf(stderr, "z_div.c: division by zero\n");
            exit(-1);
	}	  
	ratio = b->r / b->i ;
	den = b->i * (1 + ratio*ratio);
	cr = (a->r*ratio + a->i) / den;
	ci = (a->i*ratio - a->r) / den;
    } else {
	ratio = b->i / b->r ;
	den = b->r * (1 + ratio*ratio);
	cr = (a->r + a->i*ratio) / den;
	ci = (a->i - a->r*ratio) / den;
    }
    c->r = cr;
    c->i = ci;
}